

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_conn.c
# Opt level: O3

nng_err nni_http_set_redirect(nng_http *conn,nng_http_status status,char *reason,char *redirect)

{
  size_t sVar1;
  char *__s;
  char local_31;
  
  sVar1 = strlen(redirect);
  if (sVar1 < 200) {
    __s = conn->ubuf;
    snprintf(__s,200,"%s");
    local_31 = '\x03';
  }
  else {
    __s = nni_strdup(redirect);
    if (__s == (char *)0x0) {
      return NNG_ENOMEM;
    }
    local_31 = '\x01';
  }
  nni_http_del_header(conn,"Location");
  nni_list_node_remove(&(conn->location).node);
  nni_http_free_header(&conn->location);
  (conn->location).name = "Location";
  (conn->location).value = __s;
  (conn->location).field_0x20 = ((conn->location).field_0x20 & 0xfc) + local_31;
  nni_list_prepend(&(conn->res).data.hdrs,&conn->location);
  http_conn_set_error(conn,status,reason,(char *)0x0,redirect);
  return NNG_OK;
}

Assistant:

nng_err
nni_http_set_redirect(nng_http *conn, nng_http_status status,
    const char *reason, const char *redirect)
{
	char *loc;
	bool  static_value = false;

	// The only users of this api, call do not use the URL buffer after
	// doing so, so we can optimize and use that for most redirections (no
	// more allocs!)
	if (strlen(redirect) < sizeof(conn->ubuf)) {
		snprintf(conn->ubuf, sizeof(conn->ubuf), "%s", redirect);
		loc          = conn->ubuf;
		static_value = true;
	} else if ((loc = nni_strdup(redirect)) == NULL) {
		return (NNG_ENOMEM);
	}
	(void) nni_http_del_header(conn, "Location");
	nni_list_node_remove(&conn->location.node);
	nni_http_free_header(&conn->location);
	conn->location.name         = "Location";
	conn->location.value        = loc;
	conn->location.static_name  = true;
	conn->location.static_value = static_value;
	nni_list_prepend(&conn->res.data.hdrs, &conn->location);
	return (http_conn_set_error(conn, status, reason, NULL, redirect));
}